

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

MainBuilder * __thiscall
kj::MainBuilder::addOptionWithArg
          (MainBuilder *this,initializer_list<kj::MainBuilder::OptionName> names,
          Function<kj::MainBuilder::Validity_(kj::StringPtr)> *callback,StringPtr argumentTitle,
          StringPtr helpText)

{
  Impl *pIVar1;
  Option *pOVar2;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> *pFVar3;
  Option *opt;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> *callback_local;
  MainBuilder *this_local;
  StringPtr argumentTitle_local;
  initializer_list<kj::MainBuilder::OptionName> names_local;
  
  pIVar1 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  pOVar2 = Impl::addOption(pIVar1,names,true,helpText);
  pIVar1 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  pFVar3 = mv<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>>(callback);
  pFVar3 = Arena::copy<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>>
                     (&pIVar1->arena,pFVar3);
  (pOVar2->field_2).funcWithArg = pFVar3;
  (pOVar2->argTitle).content.ptr = argumentTitle.content.ptr;
  (pOVar2->argTitle).content.size_ = argumentTitle.content.size_;
  return this;
}

Assistant:

MainBuilder& MainBuilder::addOptionWithArg(std::initializer_list<OptionName> names,
                                           Function<Validity(StringPtr)> callback,
                                           StringPtr argumentTitle, StringPtr helpText) {
  auto& opt = impl->addOption(names, true, helpText);
  opt.funcWithArg = &impl->arena.copy(kj::mv(callback));
  opt.argTitle = argumentTitle;
  return *this;
}